

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int termIsEquivalence(Parse *pParse,Expr *pExpr)

{
  char cVar1;
  char cVar2;
  int iVar3;
  CollSeq *p;
  Expr *in_RSI;
  Parse *in_RDI;
  CollSeq *pColl;
  char aff2;
  char aff1;
  Parse *pParse_00;
  undefined6 in_stack_ffffffffffffffe0;
  int local_4;
  
  pParse_00 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  if ((in_RDI->db->dbOptFlags & 0x80) == 0) {
    if ((in_RSI->op == '6') || (in_RSI->op == '-')) {
      if ((in_RSI->flags & 1) == 0) {
        cVar1 = sqlite3ExprAffinity((Expr *)&DAT_aaaaaaaaaaaaaaaa);
        cVar2 = sqlite3ExprAffinity((Expr *)pParse_00);
        if ((cVar1 == cVar2) || (('B' < cVar1 && ('B' < cVar2)))) {
          p = sqlite3ExprCompareCollSeq(pParse_00,(Expr *)0x2002eb);
          iVar3 = sqlite3IsBinary(p);
          if (iVar3 == 0) {
            local_4 = sqlite3ExprCollSeqMatch
                                (in_RDI,in_RSI,
                                 (Expr *)CONCAT17(cVar1,CONCAT16(cVar2,in_stack_ffffffffffffffe0)));
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int termIsEquivalence(Parse *pParse, Expr *pExpr){
  char aff1, aff2;
  CollSeq *pColl;
  if( !OptimizationEnabled(pParse->db, SQLITE_Transitive) ) return 0;
  if( pExpr->op!=TK_EQ && pExpr->op!=TK_IS ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;
  aff1 = sqlite3ExprAffinity(pExpr->pLeft);
  aff2 = sqlite3ExprAffinity(pExpr->pRight);
  if( aff1!=aff2
   && (!sqlite3IsNumericAffinity(aff1) || !sqlite3IsNumericAffinity(aff2))
  ){
    return 0;
  }
  pColl = sqlite3ExprCompareCollSeq(pParse, pExpr);
  if( sqlite3IsBinary(pColl) ) return 1;
  return sqlite3ExprCollSeqMatch(pParse, pExpr->pLeft, pExpr->pRight);
}